

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcastu.c
# Opt level: O3

void cast_cleric_spell(monst *mtmp,int dmg,int spellnum)

{
  byte bVar1;
  boolean bVar2;
  char class;
  uint uVar3;
  permonst *ptr;
  monst *mtmp_00;
  int tmp_1;
  int iVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  long xtime;
  int tmp;
  bool bVar9;
  coord bypos;
  coord local_3a;
  permonst *local_38;
  
  if ((dmg == 0) && ((spellnum - 1U & 0xfffffffb) != 0)) {
    pcVar8 = "cast directed cleric spell (%d) with dmg=0?";
LAB_001c3ca4:
    warning(pcVar8,spellnum);
    return;
  }
  switch(spellnum) {
  case 0:
    if ((u.uprops[0x2c].extrinsic != 0) ||
       ((u.umonnum != u.umonster && (bVar2 = resists_magm(&youmonst), bVar2 != '\0')))) {
      shieldeff(u.ux,u.uy);
      dmg = (dmg - (dmg + 1 >> 0x1f)) + 1 >> 1;
    }
    if (5 < dmg) {
      pcVar8 = "Your body is covered with painful wounds!";
      if ((uint)dmg < 0x15) {
        pcVar8 = "Severe wounds appear on your body!";
      }
      pcVar7 = "Wounds appear on your body!";
      if (10 < (uint)dmg) {
        pcVar7 = pcVar8;
      }
      pline(pcVar7);
      goto LAB_001c3f0e;
    }
    pline("Your skin itches badly for a moment.");
    break;
  case 1:
    if (mtmp->mhp < mtmp->mhpmax) {
      if (mtmp->wormno == '\0') {
        if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c400c;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c4003;
          }
          else {
LAB_001c4003:
            if (ublindf == (obj *)0x0) goto LAB_001c4167;
LAB_001c400c:
            if (ublindf->oartifact != '\x1d') goto LAB_001c4167;
          }
          if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
               (((youmonst.data)->mflags3 & 0x100) == 0)) ||
              ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0)) || ((mtmp->data->mflags3 & 0x200) == 0))
          goto LAB_001c4167;
        }
      }
      else {
        bVar2 = worm_known(level,mtmp);
        if (bVar2 == '\0') goto LAB_001c4167;
      }
      uVar3 = *(uint *)&mtmp->field_0x60;
      if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((uVar3 & 0x280) != 0) goto LAB_001c4167;
      }
      else if (((uVar3 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
      goto LAB_001c4167;
      if ((u._1052_1_ & 0x20) == 0) {
        pcVar8 = Monnam(mtmp);
        pline("%s looks better.",pcVar8);
      }
LAB_001c4167:
      iVar4 = 3;
      iVar5 = -3;
      do {
        uVar3 = mt_random();
        iVar4 = iVar4 + uVar3 % 6;
        iVar5 = iVar5 + 1;
      } while (iVar5 != 0);
      iVar4 = iVar4 + mtmp->mhp;
      if (mtmp->mhpmax <= iVar4) {
        iVar4 = mtmp->mhpmax;
      }
      mtmp->mhp = iVar4;
      return;
    }
    break;
  case 2:
    if ((u.uprops[0x2c].extrinsic == 0) &&
       ((u.umonnum == u.umonster || (bVar2 = resists_magm(&youmonst), bVar2 == '\0')))) {
      uVar3 = u.uprops[0x1c].intrinsic;
      uVar6 = mtmp->m_lev + 1 >> 1;
      if (u.uprops[0x32].extrinsic == 0 && u.uprops[0x32].intrinsic == 0) {
        uVar6 = (uint)mtmp->m_lev;
      }
      make_confused((ulong)(uVar6 + u.uprops[0x1c].intrinsic),'\x01');
      if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
         ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
        pcVar8 = "more ";
        if (uVar3 == 0) {
          pcVar8 = "";
        }
        pcVar7 = "You feel %sconfused!";
      }
      else {
        pcVar8 = "trippier";
        if (uVar3 == 0) {
          pcVar8 = "trippy";
        }
        pcVar7 = "You feel %s!";
      }
      pline(pcVar7,pcVar8);
      return;
    }
    shieldeff(u.ux,u.uy);
    pcVar8 = "You feel momentarily dizzy.";
    goto LAB_001c395d;
  case 3:
    if ((u.uprops[0x2c].extrinsic == 0) &&
       (((u.umonnum == u.umonster || (bVar2 = resists_magm(&youmonst), bVar2 == '\0')) &&
        (u.uprops[0x38].extrinsic == 0)))) {
      if (-1 < multi) {
        pline("You are frozen in place!");
      }
      uVar3 = mtmp->m_lev + 5 >> 1;
      if (u.uprops[0x32].extrinsic == 0 && u.uprops[0x32].intrinsic == 0) {
        uVar3 = mtmp->m_lev + 4;
      }
      iVar4 = -uVar3;
    }
    else {
      shieldeff(u.ux,u.uy);
      if (-1 < multi) {
        pline("You stiffen briefly.");
      }
      iVar4 = -1;
    }
    nomul(iVar4,"paralyzed by a monster");
    return;
  case 4:
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((((youmonst.data)->mflags1 & 0x1000) == 0) &&
         (youmonst.data == mons + 0x1e || youmonst.data == mons + 0x17b)) {
        body_part(1);
      }
      else {
        pcVar8 = body_part(1);
        makeplural(pcVar8);
      }
      pline("Scales cover your %s!");
      xtime = 200;
      if (u.uprops[0x32].extrinsic != 0 || u.uprops[0x32].intrinsic != 0) {
        xtime = 100;
      }
      make_blinded(xtime,'\0');
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c3fa2;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c3f99;
      }
      else {
LAB_001c3f99:
        if (ublindf == (obj *)0x0) {
          return;
        }
LAB_001c3fa2:
        if (ublindf->oartifact != '\x1d') {
          return;
        }
      }
      pcVar8 = "Your vision quickly clears.";
LAB_001c395d:
      pline(pcVar8);
      return;
    }
    warning("no reason for monster to cast blindness spell?");
    break;
  case 5:
    uVar3 = 1;
    local_38 = mkclass(&u.uz,'\x01',0);
    class = '-';
    if (local_38 != (permonst *)0x0) {
      class = '\x01';
    }
    bVar1 = mtmp->m_lev;
    if (1 < bVar1) {
      uVar3 = mt_random();
      uVar3 = uVar3 % (uint)(bVar1 >> 1) + 1;
    }
    bVar9 = local_38 != (permonst *)0x0;
    uVar6 = 3;
    if (3 < uVar3) {
      uVar6 = uVar3;
    }
    iVar4 = uVar6 + 1;
    do {
      bVar2 = enexto(&local_3a,level,mtmp->mux,mtmp->muy,mtmp->data);
      if (bVar2 == '\0') break;
      ptr = mkclass(&u.uz,class,0);
      if ((ptr != (permonst *)0x0) &&
         (mtmp_00 = makemon(ptr,level,(int)local_3a.x,(int)local_3a.y,0), mtmp_00 != (monst *)0x0))
      {
        mtmp_00->mtame = '\0';
        mtmp_00->field_0x62 = mtmp_00->field_0x62 & 0xb7;
        set_malign(mtmp_00);
        bVar9 = true;
      }
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    if (bVar9) {
      if (local_38 == (permonst *)0x0) {
        pcVar8 = Monnam(mtmp);
        pcVar7 = "%s transforms a clump of sticks into snakes!";
      }
      else if (((((((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
                    (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0)) &&
                  (u.uprops[0xd].blocked == 0)) && (u.uprops[0xc].intrinsic == 0)) &&
                ((u.uprops[0xc].extrinsic == 0 && (((youmonst.data)->mflags1 & 0x1000000) == 0))))
               && ((mtmp->data->mflags1 & 0x1000000) == 0)) &&
              ((mtmp->mux != u.ux || (mtmp->muy != u.uy)))) {
        pcVar8 = Monnam(mtmp);
        pcVar7 = "%s summons insects around a spot near you!";
      }
      else if ((u.uprops[0x2d].extrinsic == 0) || ((mtmp->mux == u.ux && (mtmp->muy == u.uy)))) {
        pcVar8 = Monnam(mtmp);
        pcVar7 = "%s summons insects!";
      }
      else {
        pcVar8 = Monnam(mtmp);
        pcVar7 = "%s summons insects around your displaced image!";
      }
    }
    else {
      pcVar8 = Monnam(mtmp);
      pcVar7 = "%s casts at a clump of sticks, but nothing happens.";
    }
    pline(pcVar7,pcVar8);
    return;
  case 6:
    pline("You feel as if you need some help.");
    rndcurse();
    return;
  case 7:
    pline("A bolt of lightning strikes down at you from above!");
    bVar2 = ureflects("It bounces off your %s%s.","");
    if (bVar2 != '\0') {
      return;
    }
    iVar5 = (uint)(u.uprops[0x32].extrinsic == 0 && u.uprops[0x32].intrinsic == 0) * 4 + 4;
    iVar4 = iVar5;
    do {
      uVar3 = mt_random();
      iVar5 = iVar5 + uVar3 % 6;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    elec_damageu(iVar5,mtmp,(char *)0x0,0,0x14,'\x01');
    return;
  case 8:
    pline("A pillar of fire strikes all around you!");
    iVar5 = (uint)(u.uprops[0x32].extrinsic == 0 && u.uprops[0x32].intrinsic == 0) * 4 + 4;
    iVar4 = iVar5;
    do {
      uVar3 = mt_random();
      iVar5 = iVar5 + uVar3 % 6;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    fire_damageu(iVar5,mtmp,(char *)0x0,0,0x14,'\x01','\x01');
    burn_floor_paper((int)u.ux,(int)u.uy,'\x01','\0');
    return;
  case 9:
    pline("A sudden geyser slams into you from nowhere!");
    dmg = 8;
    iVar4 = -8;
    do {
      uVar3 = mt_random();
      dmg = dmg + uVar3 % 6;
      iVar4 = iVar4 + 1;
    } while (iVar4 != 0);
    if (u.uprops[0x33].extrinsic == 0 && u.uprops[0x33].intrinsic == 0) goto LAB_001c3f0e;
    dmg = dmg + 1U >> 1;
    break;
  default:
    pcVar8 = "mcastu: invalid clerical spell (%d)";
    goto LAB_001c3ca4;
  }
  if (dmg == 0) {
    return;
  }
LAB_001c3f0e:
  mdamageu(mtmp,dmg);
  return;
}

Assistant:

static void cast_cleric_spell(struct monst *mtmp, int dmg, int spellnum)
{
    if (dmg == 0 && !is_undirected_spell(AD_CLRC, spellnum)) {
	warning("cast directed cleric spell (%d) with dmg=0?", spellnum);
	return;
    }

    switch (spellnum) {
    case CLC_GEYSER:
	/* this is physical damage, not magical damage */
	pline("A sudden geyser slams into you from nowhere!");
	dmg = dice(8, 6);
	if (Half_physical_damage) dmg = (dmg + 1) / 2;
	break;
    case CLC_FIRE_PILLAR:
	pline("A pillar of fire strikes all around you!");
	fire_damageu(dice(Half_spell_damage ? 4 : 8, 6), mtmp, NULL, 0,
		     20, TRUE, TRUE);
	burn_floor_paper(u.ux, u.uy, TRUE, FALSE);
	dmg = 0;
	break;
    case CLC_LIGHTNING:
	pline("A bolt of lightning strikes down at you from above!");
	if (!ureflects("It bounces off your %s%s.", "")) {
	    elec_damageu(dice(Half_spell_damage ? 4 : 8, 6),
			 mtmp, NULL, 0, 20, TRUE);
	}
	dmg = 0;
	break;
    case CLC_CURSE_ITEMS:
	pline("You feel as if you need some help.");
	rndcurse();
	dmg = 0;
	break;
    case CLC_INSECTS:
      {
	/* Try for insects, and if there are none
	   left, go for (sticks to) snakes.  -3. */
	const struct permonst *pm = mkclass(&u.uz, S_ANT,0);
	struct monst *mtmp2 = NULL;
	char let = (pm ? S_ANT : S_SNAKE);
	boolean success;
	int i;
	coord bypos;
	int quan;

	quan = (mtmp->m_lev < 2) ? 1 : rnd((int)mtmp->m_lev / 2);
	if (quan < 3) quan = 3;
	success = pm ? TRUE : FALSE;
	for (i = 0; i <= quan; i++) {
	    if (!enexto(&bypos, level, mtmp->mux, mtmp->muy, mtmp->data))
		break;
	    if ((pm = mkclass(&u.uz, let,0)) != 0 &&
		    (mtmp2 = makemon(pm, level, bypos.x, bypos.y, NO_MM_FLAGS)) != 0) {
		success = TRUE;
		mtmp2->msleeping = mtmp2->mpeaceful = mtmp2->mtame = 0;
		set_malign(mtmp2);
	    }
	}
	/* Not quite right:
         * -- message doesn't always make sense for unseen caster (particularly
	 *    the first message)
         * -- message assumes plural monsters summoned (non-plural should be
         *    very rare, unlike in nasty())
         * -- message assumes plural monsters seen
         */
	if (!success)
	    pline("%s casts at a clump of sticks, but nothing happens.",
		Monnam(mtmp));
	else if (let == S_SNAKE)
	    pline("%s transforms a clump of sticks into snakes!",
		Monnam(mtmp));
	else if (Invisible && !perceives(mtmp->data) &&
				(mtmp->mux != u.ux || mtmp->muy != u.uy))
	    pline("%s summons insects around a spot near you!",
		Monnam(mtmp));
	else if (Displaced && (mtmp->mux != u.ux || mtmp->muy != u.uy))
	    pline("%s summons insects around your displaced image!",
		Monnam(mtmp));
	else
	    pline("%s summons insects!", Monnam(mtmp));
	dmg = 0;
	break;
      }
    case CLC_BLIND_YOU:
	/* note: resists_blnd() doesn't apply here */
	if (!Blinded) {
	    int num_eyes = eyecount(youmonst.data);
	    pline("Scales cover your %s!",
		  (num_eyes == 1) ?
		  body_part(EYE) : makeplural(body_part(EYE)));
	    make_blinded(Half_spell_damage ? 100L : 200L, FALSE);
	    if (!Blind) pline("Your vision quickly clears.");
	    dmg = 0;
	} else
	    warning("no reason for monster to cast blindness spell?");
	break;
    case CLC_PARALYZE:
	if (Antimagic || Free_action) {
	    shieldeff(u.ux, u.uy);
	    if (multi >= 0)
		pline("You stiffen briefly.");
	    nomul(-1, "paralyzed by a monster");
	} else {
	    if (multi >= 0)
		pline("You are frozen in place!");
	    dmg = 4 + (int)mtmp->m_lev;
	    if (Half_spell_damage) dmg = (dmg + 1) / 2;
	    nomul(-dmg, "paralyzed by a monster");
	}
	dmg = 0;
	break;
    case CLC_CONFUSE_YOU:
	if (Antimagic) {
	    shieldeff(u.ux, u.uy);
	    pline("You feel momentarily dizzy.");
	} else {
	    boolean oldprop = !!Confusion;

	    dmg = (int)mtmp->m_lev;
	    if (Half_spell_damage) dmg = (dmg + 1) / 2;
	    make_confused(HConfusion + dmg, TRUE);
	    if (Hallucination)
		pline("You feel %s!", oldprop ? "trippier" : "trippy");
	    else
		pline("You feel %sconfused!", oldprop ? "more " : "");
	}
	dmg = 0;
	break;
    case CLC_CURE_SELF:
	if (mtmp->mhp < mtmp->mhpmax) {
	    if (canseemon(level, mtmp))
		pline("%s looks better.", Monnam(mtmp));
	    /* note: player healing does 6d4; this used to do 1d8 */
	    if ((mtmp->mhp += dice(3,6)) > mtmp->mhpmax)
		mtmp->mhp = mtmp->mhpmax;
	    dmg = 0;
	}
	break;
    case CLC_OPEN_WOUNDS:
	if (Antimagic) {
	    shieldeff(u.ux, u.uy);
	    dmg = (dmg + 1) / 2;
	}
	if (dmg <= 5)
	    pline("Your skin itches badly for a moment.");
	else if (dmg <= 10)
	    pline("Wounds appear on your body!");
	else if (dmg <= 20)
	    pline("Severe wounds appear on your body!");
	else
	    pline("Your body is covered with painful wounds!");
	break;
    default:
	warning("mcastu: invalid clerical spell (%d)", spellnum);
	dmg = 0;
	break;
    }

    if (dmg) mdamageu(mtmp, dmg);
}